

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O2

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::PropagateObjContexts
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this)

{
  int iVar1;
  pointer pQVar2;
  Env *pEVar3;
  CtxVal CVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  ArrayRef<double> objwgt;
  ArrayRef<double> local_50;
  
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMOWeights(&local_50,
                 &this->
                  super_MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                );
  lVar5 = 0xa8;
  uVar6 = 0;
  while( true ) {
    pQVar2 = (this->super_FlatModel<mp::DefaultFlatModelParams>).objs_.
             super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->super_FlatModel<mp::DefaultFlatModelParams>).objs_.
                       super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pQVar2) / 0x1e8) <= uVar6)
    break;
    iVar1 = *(int *)((long)pQVar2 + lVar5 + -0xa8);
    CVar4 = (CtxVal)(iVar1 == 1);
    pEVar3 = (this->super_EnvKeeper).env_;
    if (((pEVar3->objno_ < 0) && (pEVar3->multiobj_ != 0)) &&
       (local_50.data_[uVar6] <= 0.0 && local_50.data_[uVar6] != 0.0)) {
      CVar4 = (CtxVal)(iVar1 != 1);
      *(CtxVal *)((long)pQVar2 + lVar5 + -0xa4) = CVar4;
    }
    ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::PropagateResult2LinTerms
              ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(LinTerms *)((long)pQVar2 + lVar5 + -0xa0),-INFINITY,INFINITY,
               (Context)(CVar4 ^ CTX_NEG));
    ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::PropagateResult2QuadTerms
              ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)this,(QuadTerms *)
                       ((long)&(((this->super_FlatModel<mp::DefaultFlatModelParams>).objs_.
                                 super__Vector_base<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_NLObjective).
                               super_LinearObjective.lt_ + lVar5 + 0xfffffffffffffff8U),-INFINITY,
               INFINITY,(Context)(CVar4 ^ CTX_NEG));
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x1e8;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_50);
  return;
}

Assistant:

void PropagateObjContexts() {
    auto& objs = MPD( get_objectives() );
    const auto objwgt = MPD( GetMOWeights() );
    if (GetEnv().multiobj())               // only in obj:multi mode
      assert(objs.size() == objwgt.size());
    for (size_t i=0; i<objs.size(); ++i) {
      auto isMax = obj::MAX==objs[i].obj_sense();
      if (GetEnv().multiobj() && objwgt[i]<0.0) {  // only in obj:multi
        isMax = !isMax;
        objs[i].set_sense_true(isMax ? obj::MAX : obj::MIN);
      }
      auto ctx = isMax ? Context::CTX_POS : Context::CTX_NEG;
      MPD( PropagateResult2LinTerms(objs[i].GetLinTerms(),
                          MPD( MinusInfty() ), MPD( Infty() ), ctx) );
      MPD( PropagateResult2QuadTerms(objs[i].GetQPTerms(),
                          MPD( MinusInfty() ), MPD( Infty() ), ctx) );
    }
  }